

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weight_constraint.cpp
# Opt level: O0

void __thiscall
Clasp::WeightConstraint::reason(WeightConstraint *this,Solver *s,Literal p,LitVec *r)

{
  bool bVar1;
  uint uVar2;
  ActiveConstraint AVar3;
  uint32 i_00;
  WeightConstraint *in_RCX;
  undefined4 in_EDX;
  long in_RDI;
  UndoInfo u;
  uint32 i;
  uint32 stop;
  Literal x;
  Solver *in_stack_ffffffffffffff98;
  ActiveConstraint in_stack_ffffffffffffffa0;
  Literal in_stack_ffffffffffffffa4;
  WeightConstraint *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  UndoInfo local_34;
  uint local_30;
  undefined4 local_2c;
  uint local_28;
  Literal local_24;
  WeightConstraint *local_20;
  undefined4 local_4;
  
  local_20 = in_RCX;
  local_4 = in_EDX;
  Literal::Literal(&local_24);
  bVar1 = isWeight((WeightConstraint *)0x217d75);
  if (bVar1) {
    local_2c = local_4;
    uVar2 = Solver::reasonData(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa4);
  }
  else {
    uVar2 = *(uint *)(in_RDI + 0x10) & 0x7ffffff;
  }
  local_28 = uVar2;
  for (local_30 = undoStart((WeightConstraint *)0x217db8); local_30 != local_28;
      local_30 = local_30 + 1) {
    local_34.data = *(uint32 *)(in_RDI + 0x1c + (ulong)local_30 * 4);
    AVar3 = UndoInfo::constraint(&local_34);
    if (AVar3 == (*(uint *)(in_RDI + 0x10) >> 0x1c & 3)) {
      i_00 = UndoInfo::idx(&local_34);
      UndoInfo::constraint(&local_34);
      local_24 = lit(in_stack_ffffffffffffffa8,i_00,in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa8 = local_20;
      Literal::operator~((Literal *)in_stack_ffffffffffffff98);
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)
                 CONCAT44(uVar2,in_stack_ffffffffffffffb0),(Literal *)in_stack_ffffffffffffffa8);
    }
  }
  return;
}

Assistant:

void WeightConstraint::reason(Solver& s, Literal p, LitVec& r) {
	assert(active_ != NOT_ACTIVE);
	Literal x;
	uint32 stop = !isWeight() ? up_ : s.reasonData(p);
	assert(stop <= up_);
	for (uint32 i = undoStart(); i != stop; ++i) {
		UndoInfo u = undo_[i];
		// Consider only lits that are relevant to the active constraint
		if (u.constraint() == (ActiveConstraint)active_) {
			x = lit(u.idx(), u.constraint());
			r.push_back( ~x );
		}
	}
}